

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-link.h
# Opt level: O2

void __thiscall
mp::pre::
BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
::FillEntryItems(BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
                 *this,EntryItems *ei,LinkEntry *en)

{
  pointer pNVar1;
  value_type pVVar2;
  const_reference ppVVar3;
  const_reference pvVar4;
  size_type __n;
  NodeRange local_40;
  
  pNVar1 = (ei->src_items_).
           super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ei->src_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (ei->src_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  local_40.pvn_ = (this->ndl_)._M_elems[0];
  local_40.ir_.end_ = en->_M_elems[0] + 1;
  local_40.ir_.beg_ = en->_M_elems[0];
  std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::
  emplace_back<mp::pre::NodeRange>(&ei->src_items_,&local_40);
  pNVar1 = (ei->dest_items_).
           super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ei->dest_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
      _M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (ei->dest_items_).super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  for (__n = 1; __n != 3; __n = __n + 1) {
    ppVVar3 = std::array<mp::pre::ValueNode_*,_3UL>::at(&this->ndl_,__n);
    pVVar2 = *ppVVar3;
    pvVar4 = std::array<int,_3UL>::at(en,__n);
    local_40.ir_.end_ = *pvVar4 + 1;
    local_40.ir_.beg_ = *pvVar4;
    local_40.pvn_ = pVVar2;
    std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::
    emplace_back<mp::pre::NodeRange>(&ei->dest_items_,&local_40);
  }
  return;
}

Assistant:

void FillEntryItems(typename Base::EntryItems& ei,
                      const LinkEntry& en) const {
    ei.src_items_.clear();
    int i=0;
    for ( ; i<NSources; ++i)
      ei.src_items_.push_back({ndl_.at(i), en.at(i)});
    ei.dest_items_.clear();
    for ( ; i<NIndexes; ++i)
      ei.dest_items_.push_back({ndl_.at(i), en.at(i)});
  }